

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
::insert_at<int>(iterator *__return_storage_ptr__,
                dense_hashtable<int,_int,_std::hash<int>,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::Identity,_google::dense_hash_set<int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<int>_>
                *this,size_type pos,int *args)

{
  size_type sVar1;
  pointer piVar2;
  length_error *this_00;
  
  sVar1 = this->num_deleted;
  if (this->num_elements - sVar1 < 0x3fffffffffffffff) {
    piVar2 = this->table;
    if ((sVar1 == 0) || ((this->key_info).delkey != piVar2[pos])) {
      this->num_elements = this->num_elements + 1;
    }
    else {
      this->num_deleted = sVar1 - 1;
    }
    piVar2[pos] = *args;
    sVar1 = this->num_buckets;
    __return_storage_ptr__->ht = this;
    __return_storage_ptr__->pos = piVar2 + pos;
    __return_storage_ptr__->end = piVar2 + sVar1;
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }